

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osifcnet.cpp
# Opt level: O0

void __thiscall OS_HttpPayloadItem::~OS_HttpPayloadItem(OS_HttpPayloadItem *this)

{
  long in_RDI;
  
  lib_free_str((char *)0x24c0ab);
  lib_free_str((char *)0x24c0bb);
  lib_free_str((char *)0x24c0cb);
  if ((*(long *)(in_RDI + 0x10) != 0) && (*(long **)(in_RDI + 0x10) != (long *)0x0)) {
    (**(code **)(**(long **)(in_RDI + 0x10) + 8))();
  }
  return;
}

Assistant:

OS_HttpPayloadItem::~OS_HttpPayloadItem()
{
    lib_free_str(name);
    lib_free_str(val);
    lib_free_str(mime_type);
    if (stream != 0)
        delete stream;
}